

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O2

void __thiscall
serial::PortNotOpenedException::PortNotOpenedException
          (PortNotOpenedException *this,char *description)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  *(undefined ***)this = &PTR__PortNotOpenedException_00111d88;
  (this->e_what_)._M_dataplus._M_p = (pointer)&(this->e_what_).field_2;
  (this->e_what_)._M_string_length = 0;
  (this->e_what_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"PortNotOpenedException ");
  poVar1 = std::operator<<(poVar1,description);
  std::operator<<(poVar1," failed.");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->e_what_,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

PortNotOpenedException (const char * description)  {
      std::stringstream ss;
      ss << "PortNotOpenedException " << description << " failed.";
      e_what_ = ss.str();
  }